

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  char cVar1;
  bool bVar2;
  int i;
  ImGuiID id;
  char *pcVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTable *in_RDI;
  float flags;
  float fVar5;
  ImRect *unaff_retaddr;
  bool pressed;
  bool held;
  bool hovered;
  ImRect hit_rect;
  ImGuiID column_id;
  float border_y2_hit;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float hit_y2_head;
  float hit_y2_body;
  float hit_y1;
  float hit_half_width;
  ImGuiContext *g;
  float in_stack_ffffffffffffffac;
  float y2;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  byte in_stack_ffffffffffffffb6;
  byte in_stack_ffffffffffffffb7;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  ImRect *in_stack_ffffffffffffffc0;
  int local_24;
  float fVar6;
  undefined4 uVar7;
  ImGuiContext *out_hovered;
  
  uVar7 = 0x40800000;
  fVar6 = (in_RDI->OuterRect).Min.y;
  out_hovered = GImGui;
  flags = ImMax<float>((in_RDI->OuterRect).Max.y,fVar6 + in_RDI->LastOuterHeight);
  fVar5 = fVar6 + in_RDI->LastFirstRowHeight;
  for (local_24 = 0; local_24 < in_RDI->ColumnsCount; local_24 = local_24 + 1) {
    if ((in_RDI->EnabledMaskByDisplayOrder & 1L << ((byte)local_24 & 0x3f)) != 0) {
      pcVar3 = ImSpan<signed_char>::operator[](&in_RDI->DisplayOrderToIndex,local_24);
      cVar1 = *pcVar3;
      i = (int)cVar1;
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&in_RDI->Columns,i);
      if ((pIVar4->Flags & 0x40000020U) == 0) {
        y2 = flags;
        if ((in_RDI->Flags & 0x800U) != 0) {
          y2 = fVar5;
        }
        if ((((in_RDI->Flags & 0x800U) == 0) || ((in_RDI->IsUsingHeaders & 1U) != 0)) &&
           (((pIVar4->IsVisibleX & 1U) != 0 || (in_RDI->LastResizedColumn == i)))) {
          id = TableGetColumnResizeID(in_RDI,i,(int)in_RDI->InstanceCurrent);
          ImRect::ImRect(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8,
                         (float)CONCAT13(in_stack_ffffffffffffffb7,
                                         CONCAT12(in_stack_ffffffffffffffb6,
                                                  CONCAT11(in_stack_ffffffffffffffb5,
                                                           in_stack_ffffffffffffffb4))),y2);
          KeepAliveID(id);
          in_stack_ffffffffffffffb7 = 0;
          in_stack_ffffffffffffffb6 = 0;
          in_stack_ffffffffffffffb5 =
               ButtonBehavior(unaff_retaddr,(ImGuiID)((ulong)in_RDI >> 0x20),
                              &out_hovered->Initialized,(bool *)CONCAT44(uVar7,fVar6),
                              (ImGuiButtonFlags)flags);
          if (((bool)in_stack_ffffffffffffffb5) && (bVar2 = IsMouseDoubleClicked(0), bVar2)) {
            TableSetColumnWidthAutoSingle
                      ((ImGuiTable *)
                       CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT15(in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,y2)))),
                       (int)in_stack_ffffffffffffffac);
            ClearActiveID();
            in_stack_ffffffffffffffb7 = 0;
            in_stack_ffffffffffffffb6 = 0;
          }
          if ((in_stack_ffffffffffffffb6 & 1) != 0) {
            if (in_RDI->LastResizedColumn == -1) {
              if (in_RDI->RightMostEnabledColumn == -1) {
                in_stack_ffffffffffffffac = -3.4028235e+38;
              }
              else {
                pIVar4 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&in_RDI->Columns,(int)in_RDI->RightMostEnabledColumn);
                in_stack_ffffffffffffffac = pIVar4->MaxX;
              }
              in_RDI->ResizeLockMinContentsX2 = in_stack_ffffffffffffffac;
            }
            in_RDI->ResizedColumn = cVar1;
            in_RDI->InstanceInteracted = in_RDI->InstanceCurrent;
          }
          if ((((in_stack_ffffffffffffffb7 & 1) != 0) && (0.06 < out_hovered->HoveredIdTimer)) ||
             ((in_stack_ffffffffffffffb6 & 1) != 0)) {
            in_RDI->HoveredColumnBorder = cVar1;
            SetMouseCursor(4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}